

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::priority_queue_t(priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   *this,coefficient_t _modulus,size_t _dense_threshold)

{
  std::
  priority_queue<filtration_entry_t,std::deque<filtration_entry_t,std::allocator<filtration_entry_t>>,greater_filtration_or_smaller_index<filtration_entry_t>>
  ::priority_queue<std::deque<filtration_entry_t,std::allocator<filtration_entry_t>>,void>
            (&this->
              super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            );
  (this->coefficients)._M_h._M_buckets = &(this->coefficients)._M_h._M_single_bucket;
  (this->coefficients)._M_h._M_bucket_count = 1;
  (this->coefficients)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->coefficients)._M_h._M_element_count = 0;
  (this->coefficients)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->coefficients)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->coefficients)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->use_dense_version = true;
  this->modulus = _modulus;
  this->dense_threshold = _dense_threshold;
  return;
}

Assistant:

priority_queue_t(coefficient_t _modulus, size_t _dense_threshold)
	    : modulus(_modulus), dense_threshold(_dense_threshold) {}